

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::Clear(ClipperOffset *this)

{
  int iVar1;
  reference ppPVar2;
  int local_14;
  int i;
  ClipperOffset *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = PolyNode::ChildCount(&this->m_polyNodes);
    if (iVar1 <= local_14) break;
    ppPVar2 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[](&(this->m_polyNodes).Childs,(long)local_14);
    if (*ppPVar2 != (value_type)0x0) {
      (*(*ppPVar2)->_vptr_PolyNode[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::clear
            (&(this->m_polyNodes).Childs);
  (this->m_lowest).X = -1;
  return;
}

Assistant:

void ClipperOffset::Clear()
{
  for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    delete m_polyNodes.Childs[i];
  m_polyNodes.Childs.clear();
  m_lowest.X = -1;
}